

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesio.cpp
# Opt level: O0

void __thiscall
bal::VariableTextReader::read_variable_element_hex_
          (VariableTextReader *this,Container<unsigned_int> *value)

{
  _func_int *p_Var1;
  int local_98;
  uint local_94;
  int local_70;
  char h;
  int i;
  allocator local_59;
  string local_58 [32];
  char *local_38;
  char *token;
  literalid_t *p_current;
  size_t sStack_20;
  container_size_t value_size;
  size_t token_len;
  Container<unsigned_int> *value_local;
  VariableTextReader *this_local;
  
  token_len = (size_t)value;
  value_local = (Container<unsigned_int> *)this;
  sStack_20 = TextReader::get_current_token_len
                        ((TextReader *)
                         ((long)&this->_vptr_VariableTextReader +
                         (long)this->_vptr_VariableTextReader[-3]));
  if (sStack_20 < 3 || 0xfffffffe < sStack_20) {
    __assert_fail("token_len > 2 && token_len <= CONTAINER_SIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/variables/variablesio.cpp"
                  ,0xad,
                  "void bal::VariableTextReader::read_variable_element_hex_(Container<literalid_t> &)"
                 );
  }
  p_current._4_4_ = ((int)sStack_20 + -2) * 4;
  Container<unsigned_int>::reserve((Container<unsigned_int> *)token_len,p_current._4_4_);
  token = (char *)(*(long *)token_len + (ulong)*(uint *)(token_len + 8) * 4);
  local_38 = TextReader::get_current_token
                       ((TextReader *)
                        ((long)&this->_vptr_VariableTextReader +
                        (long)this->_vptr_VariableTextReader[-3]));
  if (*local_38 == '-') {
    p_Var1 = this->_vptr_VariableTextReader[-3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Negative hexadecimal values not supported",&local_59);
    TextReader::parse_error
              ((TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var1),
               (string *)local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  for (local_70 = 2; (ulong)(long)local_70 < sStack_20; local_70 = local_70 + 1) {
    if (local_38[local_70] < 'A') {
      local_94 = (int)local_38[local_70] - 0x30;
    }
    else {
      if (local_38[local_70] < 'a') {
        local_98 = local_38[local_70] + -0x41;
      }
      else {
        local_98 = local_38[local_70] + -0x61;
      }
      local_94 = local_98 + 10;
    }
    *(uint *)token = (uint)((local_94 & 8) != 0);
    *(uint *)(token + 4) = (uint)((local_94 & 4) != 0);
    *(uint *)(token + 8) = (uint)((local_94 & 2) != 0);
    *(uint *)(token + 0xc) = (uint)((local_94 & 1) != 0);
    token = token + 0x10;
  }
  *(container_size_t *)(token_len + 8) = p_current._4_4_ + *(int *)(token_len + 8);
  TextReader::skip_token
            ((TextReader *)
             ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
  return;
}

Assistant:

inline void VariableTextReader::read_variable_element_hex_(Container<literalid_t>& value) {
        size_t token_len = get_current_token_len();
        assert(token_len > 2 && token_len <= CONTAINER_SIZE_MAX); // prefix
        const container_size_t value_size = ((container_size_t)token_len - 2) << 2;
        value.reserve(value_size);
        
        literalid_t* p_current = value.data_ + value.size_;
        const char* const token = get_current_token();
        
        if (token[0] == '-') {
            parse_error("Negative hexadecimal values not supported");
        };
        
        for (auto i = 2; i < token_len; i++) {
            char h = _hex_value(token[i]);
            p_current[0] = literal_t__constant(h & 0b1000);
            p_current[1] = literal_t__constant(h & 0b0100);
            p_current[2] = literal_t__constant(h & 0b0010);
            p_current[3] = literal_t__constant(h & 0b0001);
            p_current += 4;
        };
        
        value.size_ += value_size;
        skip_token();
    }